

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  _func_int *p_Var4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  Option *opt_00;
  Mat local_88;
  ulong local_38;
  
  uVar3 = bottom_blob->elemsize;
  local_38 = (ulong)bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx512[-3];
  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar2 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88._20_8_ = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_avx512 +
             (long)this->_vptr_Convolution1D_x86_avx512[-3]),bottom_blob,&local_88,opt);
  iVar6 = -100;
  if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
    uVar7 = 1;
    if (opt->use_packing_layout == true) {
      uVar7 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
      if ((uVar7 & 0xf) == 0) {
        uVar7 = 0x10;
      }
      else if ((uVar7 & 7) == 0) {
        uVar7 = 8;
      }
      else {
        uVar7 = (uint)((uVar7 & 3) == 0) * 3 + 1;
      }
    }
    opt_00 = (Option *)0x5308b1;
    Mat::create(top_blob,(local_88.w + ~((iVar1 + -1) * iVar2)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx512[-3]
                                 ) + 1,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]) /
                (int)uVar7,(ulong)uVar7 * (uVar3 / local_38),uVar7,opt->blob_allocator);
    iVar6 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var4 = this->_vptr_Convolution1D_x86_avx512[-3];
      convolution1d_packed
                (&local_88,top_blob,&this->weight_data_tm,(Mat *)(&this->field_0x190 + (long)p_Var4)
                 ,*(int *)(&this->field_0xd4 + (long)p_Var4),
                 *(int *)(&this->field_0xd8 + (long)p_Var4),
                 *(int *)(&this->field_0xdc + (long)p_Var4),
                 *(int *)(&this->field_0xf4 + (long)p_Var4),
                 (Mat *)(&this->field_0xf8 + (long)p_Var4),opt_00);
      iVar6 = 0;
    }
  }
  piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar6;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}